

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void Js::DictionaryTypeHandlerBase<int>::TraceFixedFieldsAfterTypeHandlerChange
               (DynamicObject *instance,DynamicTypeHandler *oldTypeHandler,
               DynamicTypeHandler *newTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar5;
  char16_t *pcVar6;
  undefined8 uVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  char16_t *pcVar10;
  char16_t *pcVar11;
  undefined8 *puVar3;
  undefined4 extraout_var_00;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,FixMethodPropsPhase);
  if ((bVar1) && (DAT_0145948a == '\x01')) {
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])(oldTypeHandler);
    puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*newTypeHandler->_vptr_DynamicTypeHandler[0x5f])(newTypeHandler);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
    if (puVar3 == (undefined8 *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *puVar3;
    }
    if (puVar4 == (undefined8 *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *puVar4;
    }
    Output::Print(L"   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"
                  ,(instance->super_RecyclableObject).type.ptr,newTypeHandler,puVar3,uVar7,puVar4,
                  uVar5);
    Output::Print(L"   fixed fields after:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])(newTypeHandler);
    Output::Print(L"\n");
    Output::Flush();
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_014594b0,FixMethodPropsPhase);
  if ((bVar1) && (DAT_0145948a == '\x01')) {
    pcVar8 = L"changed";
    pcVar6 = L"changed";
    if (oldTypeHandler == newTypeHandler) {
      pcVar6 = L"unchanged";
    }
    pcVar9 = L"changed";
    if ((DynamicType *)(instance->super_RecyclableObject).type.ptr == oldType) {
      pcVar9 = L"unchanged";
    }
    pcVar11 = L"!=";
    pcVar10 = L"!=";
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar10 = L"==";
    }
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])();
    if ((RecyclerWeakReference<Js::DynamicObject> *)CONCAT44(extraout_var_01,iVar2) ==
        oldSingletonInstanceBefore) {
      pcVar8 = L"unchanged";
    }
    iVar2 = (*newTypeHandler->_vptr_DynamicTypeHandler[0x5f])(newTypeHandler);
    if (CONCAT44(extraout_var_02,iVar2) == 0) {
      pcVar11 = L"==";
    }
    Output::Print(L"   type %s, typeHandler %s, old singleton after %s null (%s), new singleton after %s null\n"
                  ,pcVar6,pcVar9,pcVar10,pcVar8,pcVar11);
    Output::Print(L"   fixed fields after:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])(newTypeHandler);
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::TraceFixedFieldsAfterTypeHandlerChange(
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler, DynamicTypeHandler* newTypeHandler,
        DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            RecyclerWeakReference<DynamicObject>* oldSingletonInstanceAfter = oldTypeHandler->GetSingletonInstance();
            RecyclerWeakReference<DynamicObject>* newSingletonInstanceAfter = newTypeHandler->GetSingletonInstance();
            Output::Print(_u("   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"),
                instance->GetType(), newTypeHandler,
                oldSingletonInstanceAfter, oldSingletonInstanceAfter != nullptr ? oldSingletonInstanceAfter->Get() : nullptr,
                newSingletonInstanceAfter, newSingletonInstanceAfter != nullptr ? newSingletonInstanceAfter->Get() : nullptr);
            Output::Print(_u("   fixed fields after:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("   type %s, typeHandler %s, old singleton after %s null (%s), new singleton after %s null\n"),
                oldTypeHandler != newTypeHandler ? _u("changed") : _u("unchanged"),
                oldType != instance->GetType() ? _u("changed") : _u("unchanged"),
                oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="),
                oldSingletonInstanceBefore != oldTypeHandler->GetSingletonInstance() ? _u("changed") : _u("unchanged"),
                newTypeHandler->GetSingletonInstance() == nullptr ? _u("==") : _u("!="));
            Output::Print(_u("   fixed fields after:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }